

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_fill_arc(nk_command_buffer *b,float cx,float cy,float radius,float a_min,float a_max,
                nk_color c)

{
  void *pvVar1;
  float in_XMM0_Db;
  undefined1 auVar2 [16];
  float in_XMM1_Db;
  
  if (b != (nk_command_buffer *)0x0) {
    if (0xffffff < (uint)c) {
      pvVar1 = nk_command_buffer_push(b,NK_COMMAND_ARC_FILLED,0x28);
      if (pvVar1 != (void *)0x0) {
        auVar2._0_4_ = (int)cx;
        auVar2._4_4_ = (int)cy;
        auVar2._8_4_ = (int)in_XMM0_Db;
        auVar2._12_4_ = (int)in_XMM1_Db;
        auVar2 = pshuflw(auVar2,auVar2,0xe8);
        *(int *)((long)pvVar1 + 0x10) = auVar2._0_4_;
        *(short *)((long)pvVar1 + 0x14) = (short)(int)radius;
        *(float *)((long)pvVar1 + 0x18) = a_min;
        *(float *)((long)pvVar1 + 0x1c) = a_max;
        *(short *)((long)pvVar1 + 0x20) = c._0_2_;
        *(nk_byte *)((long)pvVar1 + 0x22) = c.b;
        *(nk_byte *)((long)pvVar1 + 0x23) = c.a;
      }
    }
    return;
  }
  __assert_fail("b",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x2321,
                "void nk_fill_arc(struct nk_command_buffer *, float, float, float, float, float, struct nk_color)"
               );
}

Assistant:

NK_API void
nk_fill_arc(struct nk_command_buffer *b, float cx, float cy, float radius,
    float a_min, float a_max, struct nk_color c)
{
    struct nk_command_arc_filled *cmd;
    NK_ASSERT(b);
    if (!b || c.a == 0) return;
    cmd = (struct nk_command_arc_filled*)
        nk_command_buffer_push(b, NK_COMMAND_ARC_FILLED, sizeof(*cmd));
    if (!cmd) return;
    cmd->cx = (short)cx;
    cmd->cy = (short)cy;
    cmd->r = (unsigned short)radius;
    cmd->a[0] = a_min;
    cmd->a[1] = a_max;
    cmd->color = c;
}